

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pid.c
# Opt level: O0

void PID_Increment_Calc(PID_Increment_t *PID_Increment)

{
  PID_Increment_t *PID_Increment_local;
  
  PID_Increment_Calc::Error = PID_Increment->Ref - PID_Increment->Feedback;
  PID_Increment->PrevError = PID_Increment->LastError;
  PID_Increment->LastError = PID_Increment->Error;
  PID_Increment->Error = PID_Increment_Calc::Error;
  PID_Increment_Calc::DeltaOutput =
       PID_Increment->Kd *
       ((PID_Increment->Error - (PID_Increment->LastError + PID_Increment->LastError)) +
       PID_Increment->PrevError) +
       PID_Increment->Kp * (PID_Increment->Error - PID_Increment->LastError) +
       PID_Increment->Ki * PID_Increment->Error;
  absLimit(&PID_Increment_Calc::DeltaOutput,PID_Increment->MaxIncrease);
  PID_Increment_Calc::Output = PID_Increment->Output + PID_Increment_Calc::DeltaOutput;
  absLimit(&PID_Increment_Calc::Output,PID_Increment->MaxOutput);
  PID_Increment->Output = PID_Increment_Calc::Output;
  return;
}

Assistant:

void PID_Increment_Calc(PID_Increment_t *PID_Increment)
{
	static float Error = 0.0f, DeltaOutput = 0.0f, Output = 0.0f;
	Error = PID_Increment->Ref - PID_Increment->Feedback;
	PID_Increment->PrevError = PID_Increment->LastError;
	PID_Increment->LastError = PID_Increment->Error;
	PID_Increment->Error = Error;
	DeltaOutput = PID_Increment->Kp * (PID_Increment->Error - PID_Increment->LastError) + PID_Increment->Ki * PID_Increment->Error + PID_Increment->Kd * (PID_Increment->Error - 2 * PID_Increment->LastError + PID_Increment->PrevError);
	absLimit(&DeltaOutput, PID_Increment->MaxIncrease);
	Output = PID_Increment->Output + DeltaOutput;
	absLimit(&Output, PID_Increment->MaxOutput);
	PID_Increment->Output = Output;
}